

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O1

int eval_arg<int>(char *s,int min,int max)

{
  long *plVar1;
  runtime_error *this;
  int value;
  istringstream in;
  allocator<char> local_1bd;
  int local_1bc;
  long *local_1b8 [2];
  long local_1a8 [2];
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,s,&local_1bd);
  std::__cxx11::istringstream::istringstream(local_198,(string *)local_1b8,_S_in);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  plVar1 = (long *)std::istream::operator>>((istream *)local_198,&local_1bc);
  if ((((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) &&
      (min <= local_1bc)) && (local_1bc <= max)) {
    std::__cxx11::istringstream::~istringstream(local_198);
    std::ios_base::~ios_base(local_120);
    return local_1bc;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}